

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall ChatServer::ChatServer(ChatServer *this)

{
  Stream *pSVar1;
  allocator<char> local_31;
  string local_30 [32];
  ChatServer *local_10;
  ChatServer *this_local;
  
  local_10 = this;
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__ChatServer_0010ed38;
  std::
  map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->nicks);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"tcpin:port=8765",&local_31);
  pSVar1 = (Stream *)Dashel::Hub::connect((string *)this);
  this->listenStream = pSVar1;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

ChatServer()
	{
		listenStream = connect("tcpin:port=8765");
	}